

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O3

int Prs_ManReadInstance(Prs_Man_t *p,int Func)

{
  int InstName;
  int iVar1;
  int Entry;
  byte bVar2;
  ulong uVar3;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint uVar4;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  ulong extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  byte *pbVar5;
  byte *pbVar6;
  char *pcVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  
  pbVar6 = (byte *)p->pLimit;
  pbVar5 = (byte *)p->pCur;
  while( true ) {
    if (pbVar6 <= pbVar5) goto LAB_003eb7bb;
    while( true ) {
      bVar2 = *pbVar5;
      uVar3 = (ulong)bVar2;
      if (0x2f < uVar3) goto LAB_003eb6da;
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
      pbVar5 = pbVar5 + 1;
      p->pCur = (char *)pbVar5;
    }
    if (uVar3 != 0x2f) break;
    if (pbVar5[1] == 0x2a) {
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar6 <= pbVar5) goto LAB_003eb6d8;
      while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar6) goto LAB_003eb6d8;
      }
      pbVar5 = pbVar5 + 2;
    }
    else {
      if (pbVar5[1] != 0x2f) goto LAB_003eb81d;
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar6 <= pbVar5) {
LAB_003eb6d8:
        bVar2 = *pbVar5;
        goto LAB_003eb6da;
      }
      while (bVar2 = *pbVar5, pbVar5 = pbVar5 + 1, bVar2 != 10) {
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar6) goto LAB_003eb6d8;
      }
    }
    p->pCur = (char *)pbVar5;
  }
  if (uVar3 == 0) goto LAB_003eb7bb;
LAB_003eb6da:
  if (bVar2 != 0x23) goto LAB_003eb78f;
  do {
    pbVar5 = pbVar5 + 1;
    p->pCur = (char *)pbVar5;
  } while (0xf5 < (byte)(*pbVar5 - 0x3a));
  while (pbVar5 < pbVar6) {
    while( true ) {
      bVar2 = *pbVar5;
      uVar3 = (ulong)bVar2;
      if (0x2f < uVar3) goto LAB_003eb791;
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
      pbVar5 = pbVar5 + 1;
      p->pCur = (char *)pbVar5;
    }
    if (uVar3 != 0x2f) {
      if (uVar3 != 0) goto LAB_003eb791;
      break;
    }
    if (pbVar5[1] == 0x2a) {
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar6 <= pbVar5) goto LAB_003eb78f;
      while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar6) goto LAB_003eb78f;
      }
      pbVar5 = pbVar5 + 2;
    }
    else {
      if (pbVar5[1] != 0x2f) goto LAB_003eb81d;
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar6 <= pbVar5) goto LAB_003eb78f;
      while (bVar2 = *pbVar5, pbVar5 = pbVar5 + 1, bVar2 != 10) {
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar6) goto LAB_003eb78f;
      }
    }
    p->pCur = (char *)pbVar5;
  }
LAB_003eb7bb:
  if (p->ErrorStr[0] != '\0') goto LAB_003ec14e;
  builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
  if (p->ErrorStr[0] != '\0') goto LAB_003ec14e;
  uVar11._0_1_ = ' ';
  uVar11._1_1_ = '2';
  uVar11._2_1_ = '5';
  uVar11._3_1_ = '.';
  goto LAB_003eb805;
LAB_003eb81d:
  bVar2 = 0x2f;
LAB_003eb81f:
  if ((bVar2 == 0x5f) || (iVar1 = 0, 0xe5 < (byte)((bVar2 & 0xdf) + 0xa5))) {
    pbVar6 = pbVar5 + 1;
    do {
      do {
        p->pCur = (char *)pbVar6;
        bVar2 = *pbVar6;
        pbVar6 = pbVar6 + 1;
      } while (0xf5 < (byte)(bVar2 - 0x3a));
    } while (((bVar2 == 0x24) || (bVar2 == 0x5f)) || (0xe5 < (byte)((bVar2 & 0xdf) + 0xa5)));
    goto LAB_003eb85b;
  }
  goto LAB_003eb917;
LAB_003eba28:
  uVar4 = (uint)in_RDX;
  pbVar6 = pbVar5 + 1;
  p->pCur = (char *)pbVar6;
  bVar2 = pbVar5[1];
  if (bVar2 == 0x5c) {
    pbVar6 = pbVar5 + 2;
    pbVar5 = pbVar6;
    do {
      p->pCur = (char *)pbVar5;
      bVar2 = *pbVar5;
      pbVar5 = pbVar5 + 1;
    } while (bVar2 != 0x20);
LAB_003eba98:
    iVar1 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar6,(char *)(pbVar5 + -1),(int *)0x0);
    uVar4 = (uint)extraout_RDX_00;
    if (iVar1 != 0) {
      pbVar6 = (byte *)p->pLimit;
      pbVar5 = (byte *)p->pCur;
      uVar3 = extraout_RDX_00;
      do {
        uVar4 = (uint)uVar3;
        if (pbVar6 <= pbVar5) goto LAB_003ebe71;
        while( true ) {
          uVar3 = (ulong)*pbVar5;
          uVar4 = (uint)*pbVar5;
          if (0x2f < uVar3) goto LAB_003ebb4d;
          if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
          pbVar5 = pbVar5 + 1;
          p->pCur = (char *)pbVar5;
        }
        if (uVar3 != 0x2f) {
          if (uVar3 == 0) goto LAB_003ebe71;
          goto LAB_003ebb4d;
        }
        bVar2 = pbVar5[1];
        uVar3 = (ulong)bVar2;
        uVar4 = (uint)bVar2;
        if (bVar2 == 0x2a) {
          pbVar5 = pbVar5 + 2;
          p->pCur = (char *)pbVar5;
          if (pbVar6 <= pbVar5) goto LAB_003ebb4b;
          while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
            pbVar5 = pbVar5 + 1;
            p->pCur = (char *)pbVar5;
            if (pbVar5 == pbVar6) goto LAB_003ebb4b;
          }
          pbVar5 = pbVar5 + 2;
        }
        else {
          if (bVar2 != 0x2f) goto LAB_003ec00c;
          pbVar5 = pbVar5 + 2;
          p->pCur = (char *)pbVar5;
          if (pbVar6 <= pbVar5) goto LAB_003ebb4b;
          while (bVar2 = *pbVar5, pbVar5 = pbVar5 + 1, bVar2 != 10) {
            p->pCur = (char *)pbVar5;
            if (pbVar5 == pbVar6) goto LAB_003ebb4b;
          }
        }
        p->pCur = (char *)pbVar5;
      } while( true );
    }
  }
  else if ((bVar2 == 0x5f) || (0xe5 < (byte)((bVar2 & 0xdf) + 0xa5))) {
    pbVar5 = pbVar5 + 2;
    do {
      do {
        p->pCur = (char *)pbVar5;
        bVar2 = *pbVar5;
        pbVar5 = pbVar5 + 1;
      } while (0xf5 < (byte)(bVar2 - 0x3a));
    } while (((bVar2 == 0x24) || (bVar2 == 0x5f)) || (0xe5 < (byte)((bVar2 & 0xdf) + 0xa5)));
    goto LAB_003eba98;
  }
  if (p->ErrorStr[0] != '\0') goto LAB_003ec14e;
  builtin_strncpy(p->ErrorStr,"Cannot read formal name of the instance.",0x29);
  goto LAB_003ec106;
LAB_003ebb4b:
  uVar3 = (ulong)*pbVar5;
LAB_003ebb4d:
  uVar4 = (uint)uVar3;
  if ((char)uVar3 == '(') {
    while( true ) {
      pbVar5 = pbVar5 + 1;
      while( true ) {
        uVar4 = (uint)uVar3;
        p->pCur = (char *)pbVar5;
        if (pbVar6 <= pbVar5) goto LAB_003ebe71;
        while( true ) {
          uVar3 = (ulong)*pbVar5;
          uVar4 = (uint)*pbVar5;
          if (0x2f < uVar3) goto LAB_003ebbe0;
          if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
          pbVar5 = pbVar5 + 1;
          p->pCur = (char *)pbVar5;
        }
        if (uVar3 != 0x2f) {
          if (uVar3 == 0) goto LAB_003ebe71;
          goto LAB_003ebbe0;
        }
        bVar2 = pbVar5[1];
        uVar3 = (ulong)bVar2;
        if (bVar2 != 0x2a) break;
        pbVar5 = pbVar5 + 2;
        p->pCur = (char *)pbVar5;
        if (pbVar6 <= pbVar5) goto LAB_003ebbe0;
        while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
          pbVar5 = pbVar5 + 1;
          p->pCur = (char *)pbVar5;
          if (pbVar5 == pbVar6) goto LAB_003ebbe0;
        }
        pbVar5 = pbVar5 + 2;
      }
      if (bVar2 != 0x2f) break;
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar6 <= pbVar5) break;
      while (*pbVar5 != 10) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar6) goto LAB_003ebbe0;
      }
    }
LAB_003ebbe0:
    Entry = Prs_ManReadSignal(p);
    uVar4 = (uint)extraout_RDX_01;
    if (Entry == 0) {
      if (p->ErrorStr[0] != '\0') goto LAB_003ec14e;
      builtin_strncpy(p->ErrorStr,"Cannot read actual name of an instance.",0x28);
      goto LAB_003ec106;
    }
    if (*p->pCur == ')') {
      pbVar5 = (byte *)(p->pCur + 1);
      p->pCur = (char *)pbVar5;
      in_RDX = extraout_RDX_01;
      if (Entry != 1) {
        Vec_IntPush(&p->vTemp,iVar1);
        Vec_IntPush(&p->vTemp,Entry);
        pbVar5 = (byte *)p->pCur;
        in_RDX = extraout_RDX_02;
      }
      uVar4 = (uint)in_RDX;
      pbVar6 = (byte *)p->pLimit;
      do {
        if (pbVar6 <= pbVar5) {
LAB_003ebfaa:
          if (p->ErrorStr[0] != '\0') goto LAB_003ec14e;
          builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
          if (p->ErrorStr[0] != '\0') goto LAB_003ec14e;
          uVar12._0_1_ = ' ';
          uVar12._1_1_ = '1';
          uVar12._2_1_ = '8';
          uVar12._3_1_ = '.';
          goto LAB_003ebff4;
        }
        while( true ) {
          bVar2 = *pbVar5;
          uVar3 = (ulong)bVar2;
          if (0x2f < uVar3) goto LAB_003ebcd1;
          if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
          pbVar5 = pbVar5 + 1;
          p->pCur = (char *)pbVar5;
        }
        if (uVar3 != 0x2f) {
          if (uVar3 == 0) goto LAB_003ebfaa;
          goto LAB_003ebcd1;
        }
        if (pbVar5[1] == 0x2a) {
          pbVar5 = pbVar5 + 2;
          p->pCur = (char *)pbVar5;
          if (pbVar6 <= pbVar5) goto LAB_003ebccf;
          while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
            pbVar5 = pbVar5 + 1;
            p->pCur = (char *)pbVar5;
            if (pbVar5 == pbVar6) goto LAB_003ebccf;
          }
          pbVar5 = pbVar5 + 2;
        }
        else {
          if (pbVar5[1] != 0x2f) goto LAB_003ec07c;
          pbVar5 = pbVar5 + 2;
          p->pCur = (char *)pbVar5;
          if (pbVar6 <= pbVar5) goto LAB_003ebccf;
          while (bVar2 = *pbVar5, pbVar5 = pbVar5 + 1, bVar2 != 10) {
            p->pCur = (char *)pbVar5;
            if (pbVar5 == pbVar6) goto LAB_003ebccf;
          }
        }
        p->pCur = (char *)pbVar5;
      } while( true );
    }
    if (p->ErrorStr[0] != '\0') goto LAB_003ec14e;
    builtin_strncpy(p->ErrorStr + 0x10,"in the instance.",0x10);
    uVar8._0_1_ = 'C';
    uVar8._1_1_ = 'a';
    uVar8._2_1_ = 'n';
    uVar8._3_1_ = 'n';
    uVar9._0_1_ = 'o';
    uVar9._1_1_ = 't';
    uVar9._2_1_ = ' ';
    uVar9._3_1_ = 'r';
    uVar10._0_1_ = 'e';
    uVar10._1_1_ = 'a';
    uVar10._2_1_ = 'd';
    uVar10._3_1_ = ' ';
    uVar13._0_1_ = '\"';
    uVar13._1_1_ = ')';
    uVar13._2_1_ = '\"';
    uVar13._3_1_ = ' ';
  }
  else {
LAB_003ec00c:
    if (p->ErrorStr[0] != '\0') goto LAB_003ec14e;
    builtin_strncpy(p->ErrorStr + 0x10,"in the instance.",0x10);
    uVar8._0_1_ = 'C';
    uVar8._1_1_ = 'a';
    uVar8._2_1_ = 'n';
    uVar8._3_1_ = 'n';
    uVar9._0_1_ = 'o';
    uVar9._1_1_ = 't';
    uVar9._2_1_ = ' ';
    uVar9._3_1_ = 'r';
    uVar10._0_1_ = 'e';
    uVar10._1_1_ = 'a';
    uVar10._2_1_ = 'd';
    uVar10._3_1_ = ' ';
    uVar13._0_1_ = '\"';
    uVar13._1_1_ = '(';
    uVar13._2_1_ = '\"';
    uVar13._3_1_ = ' ';
  }
  goto LAB_003ec0ff;
LAB_003ebccf:
  bVar2 = *pbVar5;
LAB_003ebcd1:
  if (bVar2 == 0x2c) {
    pbVar5 = pbVar5 + 1;
LAB_003ebcdd:
    do {
      p->pCur = (char *)pbVar5;
      if (pbVar6 <= pbVar5) {
LAB_003ebdad:
        if (p->ErrorStr[0] != '\0') goto LAB_003ec14e;
        builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
        if (p->ErrorStr[0] != '\0') goto LAB_003ec14e;
        uVar12._0_1_ = ' ';
        uVar12._1_1_ = '1';
        uVar12._2_1_ = '9';
        uVar12._3_1_ = '.';
        goto LAB_003ebff4;
      }
      while( true ) {
        bVar2 = *pbVar5;
        uVar3 = (ulong)bVar2;
        if (0x2f < uVar3) goto LAB_003ebd70;
        if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
      }
      if (uVar3 != 0x2f) {
        if (uVar3 == 0) goto LAB_003ebdad;
        goto LAB_003ebd70;
      }
      if (pbVar5[1] != 0x2a) {
        if (pbVar5[1] != 0x2f) {
          bVar2 = 0x2f;
          goto LAB_003ec11c;
        }
        pbVar5 = pbVar5 + 2;
        p->pCur = (char *)pbVar5;
        if (pbVar6 <= pbVar5) goto LAB_003ebd6e;
        while (bVar2 = *pbVar5, pbVar5 = pbVar5 + 1, bVar2 != 10) {
          p->pCur = (char *)pbVar5;
          if (pbVar5 == pbVar6) goto LAB_003ebd6e;
        }
        goto LAB_003ebcdd;
      }
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar6 <= pbVar5) goto LAB_003ebd6e;
      while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar6) goto LAB_003ebd6e;
      }
      pbVar5 = pbVar5 + 2;
    } while( true );
  }
  if (bVar2 == 0x29) goto LAB_003ec11c;
LAB_003ec07c:
  if (p->ErrorStr[0] != '\0') goto LAB_003ec14e;
  builtin_strncpy(p->ErrorStr + 0x10,"in the instance.",0x10);
  uVar8._0_1_ = 'E';
  uVar8._1_1_ = 'x';
  uVar8._2_1_ = 'p';
  uVar8._3_1_ = 'e';
  uVar9._0_1_ = 'c';
  uVar9._1_1_ = 't';
  uVar9._2_1_ = 'i';
  uVar9._3_1_ = 'n';
  uVar10._0_1_ = 'g';
  uVar10._1_1_ = ' ';
  uVar10._2_1_ = 'c';
  uVar10._3_1_ = 'o';
  uVar13._0_1_ = 'm';
  uVar13._1_1_ = 'm';
  uVar13._2_1_ = 'a';
  uVar13._3_1_ = ' ';
LAB_003ec0ff:
  *(undefined4 *)p->ErrorStr = uVar8;
  *(undefined4 *)(p->ErrorStr + 4) = uVar9;
  *(undefined4 *)(p->ErrorStr + 8) = uVar10;
  *(undefined4 *)(p->ErrorStr + 0xc) = uVar13;
  p->ErrorStr[0x20] = '\0';
  goto LAB_003ec106;
LAB_003ebd6e:
  bVar2 = *pbVar5;
LAB_003ebd70:
  if (bVar2 != 0x2e) goto LAB_003ec11c;
  goto LAB_003eba28;
LAB_003ec11c:
  uVar4 = (p->vTemp).nSize;
  if ((int)uVar4 < 1) {
    __assert_fail("Vec_IntSize(vTemp) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                  ,0x29a,"int Prs_ManReadSignalList2(Prs_Man_t *, Vec_Int_t *)");
  }
  if ((uVar4 & 1) != 0) {
    __assert_fail("Vec_IntSize(vTemp) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                  ,0x29b,"int Prs_ManReadSignalList2(Prs_Man_t *, Vec_Int_t *)");
  }
LAB_003ebe39:
  if (bVar2 != 0x29) {
    __assert_fail("Prs_ManIsChar(p, \')\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                  ,0x46a,"int Prs_ManReadInstance(Prs_Man_t *, int)");
  }
  p->pCur = (char *)(pbVar5 + 1);
  iVar1 = Prs_ManUtilSkipSpaces(p);
  uVar4 = extraout_EDX_01;
  if (iVar1 == 0) {
    if (*p->pCur == ';') {
      Prs_NtkAddBox(p->pNtk,Func,InstName,&p->vTemp);
      return 1;
    }
    pcVar7 = "Expecting semicolon in the instance.";
  }
  else {
    pcVar7 = "Error number 29.";
  }
  goto LAB_003ec10d;
LAB_003ebe71:
  if (p->ErrorStr[0] != '\0') goto LAB_003ec14e;
  builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
  if (p->ErrorStr[0] != '\0') goto LAB_003ec14e;
  uVar12._0_1_ = ' ';
  uVar12._1_1_ = '1';
  uVar12._2_1_ = '7';
  uVar12._3_1_ = '.';
LAB_003ebff4:
  p->ErrorStr[0] = 'E';
  p->ErrorStr[1] = 'r';
  p->ErrorStr[2] = 'r';
  p->ErrorStr[3] = 'o';
  p->ErrorStr[4] = 'r';
  p->ErrorStr[5] = ' ';
  p->ErrorStr[6] = 'n';
  p->ErrorStr[7] = 'u';
  p->ErrorStr[8] = 'm';
  p->ErrorStr[9] = 'b';
  p->ErrorStr[10] = 'e';
  p->ErrorStr[0xb] = 'r';
  *(undefined4 *)(p->ErrorStr + 0xc) = uVar12;
  p->ErrorStr[0x10] = '\0';
LAB_003ec106:
  pcVar7 = "Error number 28.";
LAB_003ec10d:
  Prs_ManErrorSet(p,pcVar7,uVar4);
  return 0;
LAB_003eb78f:
  bVar2 = *pbVar5;
LAB_003eb791:
  if (bVar2 != 0x5c) goto LAB_003eb81f;
  pbVar5 = pbVar5 + 1;
  pbVar6 = pbVar5;
  do {
    p->pCur = (char *)pbVar6;
    bVar2 = *pbVar6;
    pbVar6 = pbVar6 + 1;
  } while (bVar2 != 0x20);
LAB_003eb85b:
  InstName = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar5,(char *)(pbVar6 + -1),(int *)0x0);
  pbVar5 = (byte *)p->pCur;
  in_RDX = extraout_RDX;
  iVar1 = 0;
  if (InstName != 0) {
    pbVar6 = (byte *)p->pLimit;
    while (pbVar5 < pbVar6) {
      while( true ) {
        bVar2 = *pbVar5;
        uVar3 = (ulong)bVar2;
        if (0x2f < uVar3) goto LAB_003eb91c;
        if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
      }
      if (uVar3 != 0x2f) {
        if (uVar3 != 0) goto LAB_003eb91c;
        break;
      }
      iVar1 = InstName;
      if (pbVar5[1] == 0x2a) {
        pbVar5 = pbVar5 + 2;
        p->pCur = (char *)pbVar5;
        if (pbVar6 <= pbVar5) goto LAB_003eb917;
        while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
          pbVar5 = pbVar5 + 1;
          p->pCur = (char *)pbVar5;
          if (pbVar5 == pbVar6) goto LAB_003eb917;
        }
        pbVar5 = pbVar5 + 2;
      }
      else {
        if (pbVar5[1] != 0x2f) goto LAB_003eb9c9;
        pbVar5 = pbVar5 + 2;
        p->pCur = (char *)pbVar5;
        if (pbVar6 <= pbVar5) goto LAB_003eb917;
        while (bVar2 = *pbVar5, pbVar5 = pbVar5 + 1, bVar2 != 10) {
          p->pCur = (char *)pbVar5;
          if (pbVar5 == pbVar6) goto LAB_003eb917;
        }
      }
      p->pCur = (char *)pbVar5;
    }
    if (p->ErrorStr[0] != '\0') goto LAB_003ec14e;
    builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
    if (p->ErrorStr[0] != '\0') goto LAB_003ec14e;
    uVar11._0_1_ = ' ';
    uVar11._1_1_ = '2';
    uVar11._2_1_ = '6';
    uVar11._3_1_ = '.';
    goto LAB_003eb805;
  }
LAB_003eb917:
  InstName = iVar1;
  bVar2 = *pbVar5;
LAB_003eb91c:
  if (bVar2 == 0x28) {
    pbVar5 = pbVar5 + 1;
    p->pCur = (char *)pbVar5;
    pbVar6 = (byte *)p->pLimit;
    while (pbVar5 < pbVar6) {
      while( true ) {
        bVar2 = *pbVar5;
        uVar3 = (ulong)bVar2;
        if (0x2f < uVar3) goto LAB_003eba07;
        if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
      }
      if (uVar3 != 0x2f) {
        if (uVar3 != 0) {
LAB_003eba07:
          if (bVar2 == 0x2e) {
            (p->vTemp).nSize = 0;
            if (*pbVar5 != 0x2e) {
              __assert_fail("Prs_ManIsChar(p, \'.\')",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                            ,0x284,"int Prs_ManReadSignalList2(Prs_Man_t *, Vec_Int_t *)");
            }
            goto LAB_003eba28;
          }
LAB_003ebdfc:
          pcVar7 = Abc_NamStr(p->pStrs,Func);
          Func = Prs_ManIsVerilogPrim(pcVar7);
          if (Func == 0) {
            pcVar7 = "Cannot find elementary gate.";
            uVar4 = extraout_EDX;
            goto LAB_003ec10d;
          }
          iVar1 = Prs_ManReadSignalList(p,&p->vTemp,')',1);
          uVar4 = extraout_EDX_00;
          if (iVar1 == 0) goto LAB_003ec106;
          pbVar5 = (byte *)p->pCur;
          bVar2 = *pbVar5;
          goto LAB_003ebe39;
        }
        break;
      }
      if (pbVar5[1] == 0x2a) {
        pbVar5 = pbVar5 + 2;
        p->pCur = (char *)pbVar5;
        if (pbVar6 <= pbVar5) {
LAB_003eba05:
          bVar2 = *pbVar5;
          goto LAB_003eba07;
        }
        while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
          pbVar5 = pbVar5 + 1;
          p->pCur = (char *)pbVar5;
          if (pbVar5 == pbVar6) goto LAB_003eba05;
        }
        pbVar5 = pbVar5 + 2;
      }
      else {
        if (pbVar5[1] != 0x2f) goto LAB_003ebdfc;
        pbVar5 = pbVar5 + 2;
        p->pCur = (char *)pbVar5;
        if (pbVar6 <= pbVar5) goto LAB_003eba05;
        while (bVar2 = *pbVar5, pbVar5 = pbVar5 + 1, bVar2 != 10) {
          p->pCur = (char *)pbVar5;
          if (pbVar5 == pbVar6) goto LAB_003eba05;
        }
      }
      p->pCur = (char *)pbVar5;
    }
    if (p->ErrorStr[0] == '\0') {
      builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
      if (p->ErrorStr[0] == '\0') {
        uVar11._0_1_ = ' ';
        uVar11._1_1_ = '2';
        uVar11._2_1_ = '7';
        uVar11._3_1_ = '.';
LAB_003eb805:
        p->ErrorStr[0] = 'E';
        p->ErrorStr[1] = 'r';
        p->ErrorStr[2] = 'r';
        p->ErrorStr[3] = 'o';
        p->ErrorStr[4] = 'r';
        p->ErrorStr[5] = ' ';
        p->ErrorStr[6] = 'n';
        p->ErrorStr[7] = 'u';
        p->ErrorStr[8] = 'm';
        p->ErrorStr[9] = 'b';
        p->ErrorStr[10] = 'e';
        p->ErrorStr[0xb] = 'r';
        *(undefined4 *)(p->ErrorStr + 0xc) = uVar11;
        p->ErrorStr[0x10] = '\0';
        return 0;
      }
    }
  }
  else {
LAB_003eb9c9:
    if (p->ErrorStr[0] == '\0') {
      builtin_strncpy(p->ErrorStr,"Expecting \"(\" in module instantiation.",0x27);
      return 0;
    }
  }
LAB_003ec14e:
  __assert_fail("!p->ErrorStr[0]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaPrs.h"
                ,0xc0,"int Prs_ManErrorSet(Prs_Man_t *, char *, int)");
}

Assistant:

static inline int Prs_ManReadInstance( Prs_Man_t * p, int Func )
{
    int InstId, Status;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 25.", 0);
    if ( Prs_ManIsChar(p, '#') )
    {
        p->pCur++;
        while ( Prs_ManIsDigit(p) )
            p->pCur++;
        if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 25.", 0);
    }
    if ( (InstId = Prs_ManReadName(p)) )
        if (Prs_ManUtilSkipSpaces(p))       return Prs_ManErrorSet(p, "Error number 26.", 0);
    if ( !Prs_ManIsChar(p, '(') )           return Prs_ManErrorSet(p, "Expecting \"(\" in module instantiation.", 0);
    p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 27.", 0);
    if ( Prs_ManIsChar(p, '.') ) // box
        Status = Prs_ManReadSignalList2(p, &p->vTemp);
    else  // node
    {
        //char * s = Abc_NamStr(p->pStrs, Func);
        // translate elementary gate
        int iFuncNew = Prs_ManIsVerilogPrim(Abc_NamStr(p->pStrs, Func));
        if ( iFuncNew == 0 )                return Prs_ManErrorSet(p, "Cannot find elementary gate.", 0);
        Func = iFuncNew;
        Status = Prs_ManReadSignalList( p, &p->vTemp, ')', 1 );
    }
    if ( Status == 0 )                      return Prs_ManErrorSet(p, "Error number 28.", 0);
    assert( Prs_ManIsChar(p, ')') );
    p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 29.", 0);
    if ( !Prs_ManIsChar(p, ';') )           return Prs_ManErrorSet(p, "Expecting semicolon in the instance.", 0);
    // add box 
    Prs_NtkAddBox( p->pNtk, Func, InstId, &p->vTemp );
    return 1;
}